

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_drm.c
# Opt level: O0

int drm_ioctl(int fd,int req,void *arg)

{
  uint uVar1;
  int *piVar2;
  char *pcVar3;
  bool bVar4;
  int ret;
  void *arg_local;
  int req_local;
  int fd_local;
  
  do {
    uVar1 = ioctl(fd,(long)req,arg);
    bVar4 = false;
    if (uVar1 == 0xffffffff) {
      piVar2 = __errno_location();
      bVar4 = true;
      if (*piVar2 != 4) {
        piVar2 = __errno_location();
        bVar4 = *piVar2 == 0xb;
      }
    }
  } while (bVar4);
  if ((drm_debug & 4) != 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    _mpp_log_l(4,"mpp_drm","%x ret %d: %s\n","drm_ioctl",(ulong)(uint)req,(ulong)uVar1,pcVar3);
  }
  return uVar1;
}

Assistant:

static int drm_ioctl(int fd, int req, void *arg)
{
    int ret;

    do {
        ret = ioctl(fd, req, arg);
    } while (ret == -1 && (errno == EINTR || errno == EAGAIN));

    drm_dbg_ioctl("%x ret %d: %s\n", req, ret, strerror(errno));

    return ret;
}